

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EBAmrUtil.cpp
# Opt level: O0

void amrex::TagVolfrac(TagBoxArray *tags,MultiFab *volfrac,Real tol)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  undefined8 in_RSI;
  undefined1 do_tiling_;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_XMM0_Qa;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *volarr;
  Array4<char> *tagarr;
  Box *bx;
  MFIter mfi;
  char tagval;
  FBData<amrex::TagBox> *in_stack_fffffffffffffd60;
  FabArray<amrex::FArrayBox> *this;
  FabArray<amrex::TagBox> *this_00;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  int iVar4;
  undefined4 in_stack_fffffffffffffd90;
  uint uVar5;
  undefined4 in_stack_fffffffffffffd94;
  int in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  long local_228;
  long local_220;
  long local_218;
  int local_208;
  int local_204;
  int local_200;
  FabArray<amrex::FArrayBox> *local_1e8;
  undefined1 local_1e0 [104];
  _Head_base<0UL,_amrex::FBData<amrex::TagBox>_*,_false> local_178;
  undefined1 local_109;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  _Head_base<0UL,_amrex::FabArrayBase_*,_false> local_f0;
  int local_e8;
  FBData<amrex::TagBox> *local_e0;
  int local_d4;
  uint uStack_d0;
  int local_cc;
  pointer local_c8;
  uint local_c0;
  MultiArray4<double> local_b8;
  int local_b0;
  int iStack_ac;
  uint local_a8;
  int local_a4;
  uint local_a0;
  int local_9c;
  RefID local_98;
  int local_8c;
  uint local_88;
  int local_84;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> local_80;
  int local_74;
  uint local_70;
  int local_6c;
  _Head_base<0UL,_amrex::FabArray<amrex::FArrayBox>_*,_false> local_68;
  undefined4 local_5c;
  int *local_58;
  undefined4 local_4c;
  MultiArray4<char> local_48;
  undefined4 local_3c;
  pointer local_38;
  undefined4 local_2c;
  FBData<amrex::TagBox> *local_28;
  undefined4 local_1c;
  FBData<amrex::TagBox> *local_18;
  undefined4 local_c;
  _Head_base<0UL,_amrex::FBData<amrex::TagBox>_*,_false> local_8;
  
  do_tiling_ = (undefined1)((ulong)in_RSI >> 0x38);
  local_109 = 2;
  local_108._M_pi = in_XMM0_Qa;
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                 (FabArrayBase *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88),
                 (bool)do_tiling_);
  while (bVar2 = MFIter::isValid((MFIter *)&stack0xfffffffffffffe90), bVar2) {
    in_stack_fffffffffffffd60 = (FBData<amrex::TagBox> *)(local_1e0 + 0x4c);
    this_00 = (FabArray<amrex::TagBox> *)&stack0xfffffffffffffe90;
    MFIter::tilebox((MFIter *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0));
    this = (FabArray<amrex::FArrayBox> *)local_1e0;
    local_178._M_head_impl = in_stack_fffffffffffffd60;
    FabArray<amrex::TagBox>::array<amrex::TagBox,_0>(this_00,(MFIter *)this);
    local_1e0._64_8_ = this;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (this,(MFIter *)in_stack_fffffffffffffd60);
    local_e0 = local_178._M_head_impl;
    local_8._M_head_impl = local_178._M_head_impl;
    local_c = 0;
    local_d4 = *(int *)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           *)&(local_178._M_head_impl)->fb)->_M_t).
                        super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                        .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_18 = local_178._M_head_impl;
    local_1c = 1;
    uStack_d0 = *(uint *)((long)&(((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                    *)&(local_178._M_head_impl)->fb)->_M_t).
                                 super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                 .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl +
                         4);
    local_f0._M_head_impl =
         (((unique_ptr<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
          &(local_178._M_head_impl)->fb)->_M_t).
         super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
         super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
         super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl;
    local_28 = local_178._M_head_impl;
    local_2c = 2;
    in_stack_fffffffffffffdc0 = (local_178._M_head_impl)->scomp;
    local_b8.hp = (Array4<double> *)local_178._M_head_impl;
    local_38 = (pointer)&(local_178._M_head_impl)->ncomp;
    local_3c = 0;
    local_b0 = *(int *)local_38;
    local_48.hp = (Array4<char> *)&(local_178._M_head_impl)->ncomp;
    local_4c = 1;
    iStack_ac = ((IntVect *)&(local_178._M_head_impl)->the_recv_data)->vect[0];
    local_c8 = *(pointer *)local_38;
    local_58 = &(local_178._M_head_impl)->ncomp;
    local_5c = 2;
    local_c0 = ((IntVect *)&(local_178._M_head_impl)->the_recv_data)->vect[1];
    for (iVar3 = in_stack_fffffffffffffdc0; uVar5 = uStack_d0, iVar3 <= (int)local_c0;
        iVar3 = iVar3 + 1) {
      for (; iVar1 = local_d4, (int)uVar5 <= iStack_ac; uVar5 = uVar5 + 1) {
        while (iVar4 = iVar1, iVar4 <= local_b0) {
          if ((*(double *)
                (local_228 +
                ((long)(iVar4 - local_208) + (int)(uVar5 - local_204) * local_220 +
                (iVar3 - local_200) * local_218) * 8) <= 1.0 - (double)local_108._M_pi) &&
             (local_8c = iVar3, local_88 = uVar5, local_84 = iVar4,
             local_80._M_head_impl = (FabArray<amrex::FArrayBox> *)&local_228,
             (double)local_108._M_pi <=
             *(double *)
              (local_228 +
              ((long)(iVar4 - local_208) + (int)(uVar5 - local_204) * local_220 +
              (iVar3 - local_200) * local_218) * 8))) {
            local_98.data = (Ref *)local_1e0._64_8_;
            *(undefined1 *)
             (*(long *)local_1e0._64_8_ +
             (long)(iVar4 - *(int *)(local_1e0._64_8_ + 0x20)) +
             (long)(int)(uVar5 - *(int *)(local_1e0._64_8_ + 0x24)) *
             *(long *)&((BoxArray *)(local_1e0._64_8_ + 8))->m_bat +
             (long)(iVar3 - *(int *)(local_1e0._64_8_ + 0x28)) * *(long *)(local_1e0._64_8_ + 0x10))
                 = 2;
            local_a4 = iVar3;
            local_a0 = uVar5;
            local_9c = iVar4;
          }
          local_74 = iVar3;
          local_70 = uVar5;
          local_6c = iVar4;
          local_68._M_head_impl = (FabArray<amrex::FArrayBox> *)&local_228;
          iVar1 = iVar4 + 1;
        }
      }
    }
    local_1e8 = (FabArray<amrex::FArrayBox> *)&local_228;
    local_e8 = in_stack_fffffffffffffdc0;
    local_cc = in_stack_fffffffffffffdc0;
    local_a8 = local_c0;
    MFIter::operator++((MFIter *)&stack0xfffffffffffffe90);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffd60);
  return;
}

Assistant:

void
TagVolfrac (TagBoxArray& tags, const MultiFab& volfrac, Real tol)
{
    BL_PROFILE("amrex::TagVolfrac()");

//    const char clearval = TagBox::CLEAR;
    const char   tagval = TagBox::SET;

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(volfrac, TilingIfNotGPU()); mfi.isValid(); ++mfi) {
        const Box& bx = mfi.tilebox();
        Array4<char> const& tagarr = tags.array(mfi);
        Array4<Real const> const& volarr = volfrac.const_array(mfi);
        AMREX_HOST_DEVICE_FOR_3D ( bx, i, j, k,
        {
            if (volarr(i,j,k) <= (1.-tol) && volarr(i,j,k) >= tol) {
                tagarr(i,j,k) = tagval;
            }
        });
    }
}